

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

long __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetLongValue
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          char *a_pKey,long a_nDefault,bool *a_pHasMultiple)

{
  bool bVar1;
  char *a_pInputData;
  char *local_a0;
  char *pszSuffix;
  long nValue;
  char local_88;
  char local_87;
  char local_86 [5];
  SI_ConvertA<char> c;
  char szValue [64];
  char *pszValue;
  bool *a_pHasMultiple_local;
  long a_nDefault_local;
  char *a_pKey_local;
  char *a_pSection_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  a_pInputData = GetValue(this,a_pSection,a_pKey,(char *)0x0,a_pHasMultiple);
  this_local = (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)a_nDefault;
  if ((a_pInputData != (char *)0x0) && (*a_pInputData != '\0')) {
    memset(&local_88,0,0x40);
    SI_ConvertA<char>::SI_ConvertA
              ((SI_ConvertA<char> *)((long)&nValue + 7),(bool)(this->m_bStoreIsUtf8 & 1));
    bVar1 = SI_ConvertA<char>::ConvertToStore
                      ((SI_ConvertA<char> *)((long)&nValue + 7),a_pInputData,&local_88,0x40);
    if (bVar1) {
      local_a0 = &local_88;
      pszSuffix = (char *)a_nDefault;
      if ((local_88 == '0') && ((local_87 == 'x' || (local_87 == 'X')))) {
        if (local_86[0] == '\0') {
          return a_nDefault;
        }
        pszSuffix = (char *)strtol(local_86,&local_a0,0x10);
      }
      else {
        pszSuffix = (char *)strtol(&local_88,&local_a0,10);
      }
      if (*local_a0 == '\0') {
        this_local = (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)pszSuffix;
      }
    }
  }
  return (long)this_local;
}

Assistant:

long
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::GetLongValue(
    const SI_CHAR * a_pSection,
    const SI_CHAR * a_pKey,
    long            a_nDefault,
    bool *          a_pHasMultiple
    ) const
{
    // return the default if we don't have a value
    const SI_CHAR * pszValue = GetValue(a_pSection, a_pKey, NULL, a_pHasMultiple);
    if (!pszValue || !*pszValue) return a_nDefault;

    // convert to UTF-8/MBCS which for a numeric value will be the same as ASCII
    char szValue[64] = { 0 };
    SI_CONVERTER c(m_bStoreIsUtf8);
    if (!c.ConvertToStore(pszValue, szValue, sizeof(szValue))) {
        return a_nDefault;
    }

    // handle the value as hex if prefaced with "0x"
    long nValue = a_nDefault;
    char * pszSuffix = szValue;
    if (szValue[0] == '0' && (szValue[1] == 'x' || szValue[1] == 'X')) {
    	if (!szValue[2]) return a_nDefault;
        nValue = strtol(&szValue[2], &pszSuffix, 16);
    }
    else {
        nValue = strtol(szValue, &pszSuffix, 10);
    }

    // any invalid strings will return the default value
    if (*pszSuffix) {
        return a_nDefault;
    }

    return nValue;
}